

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeResizeBilinearLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar2;
  ShapeRange *pSVar3;
  LayerUnion from;
  Arena *val;
  size_t val_00;
  ResizeBilinearLayerParams resize;
  ShapeRange SStack_1d8;
  ShapeRange local_1b8;
  ResizeBilinearLayerParams local_180 [3];
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect(&local_1b8,pSVar2,pSVar3);
  ShapeConstraint::updateSequenceRange(this_01,&local_1b8);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect(&local_1b8,pSVar2,pSVar3);
  ShapeConstraint::updateBatchRange(this_01,&local_1b8);
  pSVar2 = ShapeConstraint::channelRange(this_01);
  pSVar3 = ShapeConstraint::channelRange(this_00);
  ShapeRange::intersect(&local_1b8,pSVar2,pSVar3);
  ShapeConstraint::updateChannelRange(this_01,&local_1b8);
  if (specLayer->_oneof_case_[0] == 0xd3) {
    from = specLayer->layer_;
  }
  else {
    from.resizebilinear_ = Specification::ResizeBilinearLayerParams::default_instance();
  }
  Specification::ResizeBilinearLayerParams::ResizeBilinearLayerParams
            (local_180,from.resizebilinear_);
  val_00 = 1;
  val = (Arena *)0x1;
  if (local_180[0].targetsize_.current_size_ == 2) {
    if ((local_180[0].targetsize_.rep_)->elements[0] != 0) {
      val_00 = (local_180[0].targetsize_.rep_)->elements[0];
    }
    if (local_180[0].targetsize_.rep_[1].arena == (Arena *)0x0) {
      val = (Arena *)0x1;
    }
    else {
      val = local_180[0].targetsize_.rep_[1].arena;
    }
  }
  ShapeConstraint::setHeight(this_01,val_00);
  ShapeConstraint::setWidth(this_01,(size_t)val);
  pSVar2 = ShapeConstraint::sequenceRange(this_00);
  pSVar3 = ShapeConstraint::sequenceRange(this_01);
  ShapeRange::intersect(&SStack_1d8,pSVar2,pSVar3);
  ShapeConstraint::updateSequenceRange(this_00,&SStack_1d8);
  pSVar2 = ShapeConstraint::batchRange(this_00);
  pSVar3 = ShapeConstraint::batchRange(this_01);
  ShapeRange::intersect(&SStack_1d8,pSVar2,pSVar3);
  ShapeConstraint::updateBatchRange(this_00,&SStack_1d8);
  pSVar2 = ShapeConstraint::channelRange(this_00);
  pSVar3 = ShapeConstraint::channelRange(this_01);
  ShapeRange::intersect(&SStack_1d8,pSVar2,pSVar3);
  ShapeConstraint::updateChannelRange(this_00,&SStack_1d8);
  Specification::ResizeBilinearLayerParams::~ResizeBilinearLayerParams(local_180);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeResizeBilinearLayer(const Specification::NeuralNetworkLayer& specLayer) {

    // Input shape: [Seq, B, C, H_in, W_out]
    // Output shape: [Seq, B, C, H_out, W_out]

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Resize Bilinear layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Resize Bilinear layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // For forward pass: update the output shape ranges
    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));

    Specification::ResizeBilinearLayerParams resize = specLayer.resizebilinear();

    size_t target_h = 1;
    size_t target_w = 1;

    if (resize.targetsize_size() == 2) {
        target_h = (resize.targetsize(0) == 0) ? 1 : (size_t)resize.targetsize(0); //height
        target_w = (resize.targetsize(1) == 0) ? 1 : (size_t)resize.targetsize(1); //width
    }

    outputShape.setHeight(target_h);
    outputShape.setWidth(target_w);

    // For backward pass: update the input shape ranges
    inputShape.updateSequenceRange(inputShape.sequenceRange().intersect(outputShape.sequenceRange()));
    inputShape.updateBatchRange(inputShape.batchRange().intersect(outputShape.batchRange()));
    inputShape.updateChannelRange(inputShape.channelRange().intersect(outputShape.channelRange()));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Resize Bilinear layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Resize Bilinear layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}